

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

U32 ZSTD_litLengthPrice(U32 litLength,optState_t *optPtr,int optLevel)

{
  byte bVar1;
  U32 UVar2;
  int iVar3;
  uint uVar4;
  U32 UVar5;
  int iVar6;
  
  iVar6 = 0;
  while( true ) {
    if (0x20000 < litLength) {
      __assert_fail("litLength <= ZSTD_BLOCKSIZE_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8049,"U32 ZSTD_litLengthPrice(const U32, const optState_t *const, int)");
    }
    if (optPtr->priceType == zop_predef) break;
    if (litLength != 0x20000) {
      if (litLength < 0x40) {
        uVar4 = (uint)(byte)ZSTD_LLcode_LL_Code[litLength];
      }
      else {
        uVar4 = 0x1f;
        if (litLength != 0) {
          for (; litLength >> uVar4 == 0; uVar4 = uVar4 - 1) {
          }
        }
        uVar4 = (uVar4 ^ 0xffffffe0) + 0x33;
      }
      bVar1 = ""[uVar4];
      UVar2 = optPtr->litLengthSumBasePrice;
      if (optLevel == 0) {
        uVar4 = optPtr->litLengthFreq[uVar4] + 1;
        iVar3 = 0x1f;
        if (uVar4 != 0) {
          for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        UVar5 = iVar3 << 8;
      }
      else {
        UVar5 = ZSTD_fracWeight(optPtr->litLengthFreq[uVar4]);
      }
      UVar5 = ((uint)bVar1 * 0x100 + UVar2) - UVar5;
LAB_001a0177:
      return UVar5 + iVar6;
    }
    iVar6 = iVar6 + 0x100;
    litLength = 0x1ffff;
  }
  if (optLevel == 0) {
    iVar3 = 0x1f;
    if (litLength + 1 != 0) {
      for (; litLength + 1 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    UVar5 = iVar3 << 8;
  }
  else {
    UVar5 = ZSTD_fracWeight(litLength);
  }
  goto LAB_001a0177;
}

Assistant:

static U32 ZSTD_litLengthPrice(U32 const litLength, const optState_t* const optPtr, int optLevel)
{
    assert(litLength <= ZSTD_BLOCKSIZE_MAX);
    if (optPtr->priceType == zop_predef)
        return WEIGHT(litLength, optLevel);

    /* ZSTD_LLcode() can't compute litLength price for sizes >= ZSTD_BLOCKSIZE_MAX
     * because it isn't representable in the zstd format.
     * So instead just pretend it would cost 1 bit more than ZSTD_BLOCKSIZE_MAX - 1.
     * In such a case, the block would be all literals.
     */
    if (litLength == ZSTD_BLOCKSIZE_MAX)
        return BITCOST_MULTIPLIER + ZSTD_litLengthPrice(ZSTD_BLOCKSIZE_MAX - 1, optPtr, optLevel);

    /* dynamic statistics */
    {   U32 const llCode = ZSTD_LLcode(litLength);
        return (LL_bits[llCode] * BITCOST_MULTIPLIER)
             + optPtr->litLengthSumBasePrice
             - WEIGHT(optPtr->litLengthFreq[llCode], optLevel);
    }
}